

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * Cudd_zddDiff(DdManager *dd,DdNode *P,DdNode *Q)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *Q_local;
  DdNode *P_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddDiff(dd,P,Q);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddDiff(
  DdManager * dd,
  DdNode * P,
  DdNode * Q)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddZddDiff(dd, P, Q);
    } while (dd->reordered == 1);
    return(res);

}